

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const*&,unsigned_long_const&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
          (CWriter *this,char **t,unsigned_long *u,char (*args) [2],ExternalInstancePtr *args_1,
          char (*args_2) [9],StackVar *args_3,char (*args_4) [2])

{
  string_view local_48;
  char (*local_38) [9];
  char (*args_local_2) [9];
  ExternalInstancePtr *args_local_1;
  char (*args_local) [2];
  unsigned_long *u_local;
  char **t_local;
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [9])args_1;
  args_local_1 = (ExternalInstancePtr *)args;
  args_local = (char (*) [2])u;
  u_local = (unsigned_long *)t;
  t_local = (char **)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  anon_unknown_0::CWriter::Write((CWriter *)this,(Index)*(undefined8 *)args_local);
  Write<char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            (this,(char (*) [2])args_local_1,(ExternalInstancePtr *)args_local_2,local_38,args_3,
             args_4);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }